

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f Quat4f::squadTangent(Quat4f *before,Quat4f *center,Quat4f *after)

{
  float fVar1;
  float *pfVar2;
  Quat4f *in_RDI;
  undefined1 auVar6 [12];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined8 uVar7;
  Quat4f QVar5;
  Quat4f *unaff_retaddr;
  Quat4f *in_stack_00000008;
  int i;
  Quat4f l2;
  Quat4f l1;
  Quat4f *e;
  Quat4f *in_stack_ffffffffffffffa0;
  Quat4f *in_stack_ffffffffffffffa8;
  int local_44;
  Quat4f local_40;
  Quat4f local_30 [3];
  
  auVar4 = in_ZMM0._8_56_;
  logDifference(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QVar5 = logDifference(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  auVar3._0_8_ = QVar5.m_elements._0_8_;
  auVar3._8_56_ = auVar4;
  Quat4f(in_RDI);
  for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
    pfVar2 = operator[](local_30,local_44);
    fVar1 = *pfVar2;
    pfVar2 = operator[](&local_40,local_44);
    fVar1 = (fVar1 + *pfVar2) * -0.25;
    pfVar2 = operator[](in_RDI,local_44);
    auVar3 = ZEXT464((uint)fVar1);
    *pfVar2 = fVar1;
  }
  exp((Quat4f *)&stack0xffffffffffffff9c,auVar3._0_8_);
  QVar5 = ::operator*(in_stack_00000008,unaff_retaddr);
  operator=(in_RDI,(Quat4f *)&stack0xffffffffffffffac);
  QVar5.m_elements[0] = QVar5.m_elements[0];
  auVar6._4_4_ = QVar5.m_elements[1];
  register0x00001240 = QVar5.m_elements[2];
  register0x00001244 = QVar5.m_elements[3];
  return (Quat4f)QVar5.m_elements;
}

Assistant:

Quat4f Quat4f::squadTangent( const Quat4f& before, const Quat4f& center, const Quat4f& after )
{
	Quat4f l1 = Quat4f::logDifference( center, before );
	Quat4f l2 = Quat4f::logDifference( center, after );
	
	Quat4f e;
	for( int i = 0; i < 4; ++i )
	{
		e[ i ] = -0.25f * ( l1[ i ] + l2[ i ] );
	}
	e = center * ( e.exp() );

	return e;
}